

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

void djgt__get_glpps(GLint *state)

{
  GLint *state_local;
  
  (*glad_glGetIntegerv)(0x88ed,state);
  (*glad_glGetIntegerv)(0xd00,state + 1);
  (*glad_glGetIntegerv)(0xd01,state + 2);
  (*glad_glGetIntegerv)(0xd02,state + 3);
  (*glad_glGetIntegerv)(0x806c,state + 4);
  (*glad_glGetIntegerv)(0xd03,state + 5);
  (*glad_glGetIntegerv)(0xd04,state + 6);
  (*glad_glGetIntegerv)(0x806b,state + 7);
  (*glad_glGetIntegerv)(0xd05,state + 8);
  return;
}

Assistant:

static void djgt__get_glpps(djgt__glpss state)
{
    glGetIntegerv(GL_PIXEL_PACK_BUFFER_BINDING, state    );
    glGetIntegerv(GL_PACK_SWAP_BYTES          , state + 1);
    glGetIntegerv(GL_PACK_LSB_FIRST           , state + 2);
    glGetIntegerv(GL_PACK_ROW_LENGTH          , state + 3);
    glGetIntegerv(GL_PACK_IMAGE_HEIGHT        , state + 4);
    glGetIntegerv(GL_PACK_SKIP_ROWS           , state + 5);
    glGetIntegerv(GL_PACK_SKIP_PIXELS         , state + 6);
    glGetIntegerv(GL_PACK_SKIP_IMAGES         , state + 7);
    glGetIntegerv(GL_PACK_ALIGNMENT           , state + 8);
}